

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  CType *pCVar1;
  int iVar2;
  ulong uVar3;
  CType *d_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (d == s || (flags & 1) != 0) {
    return 1;
  }
  pCVar1 = cts->tab;
  uVar5 = (uint)(ushort)d->info;
  uVar4 = 0;
  while( true ) {
    do {
      uVar3 = (ulong)((uVar5 & 0xffff) << 4);
      uVar5 = *(uint *)((long)&pCVar1->info + uVar3);
      uVar6 = uVar5 >> 0x1c;
    } while (uVar6 == 5);
    d_00 = (CType *)((long)&pCVar1->info + uVar3);
    if (uVar6 != 8) break;
    if ((uVar5 & 0xff0000) == 0x10000) {
      uVar4 = uVar4 | d_00->size;
    }
  }
  uVar7 = s->info;
  uVar8 = 0;
  if ((uVar7 & 0xf0000000) != 0x10000000) {
    uVar8 = 0;
    while( true ) {
      do {
        uVar3 = (ulong)((uVar7 & 0xffff) << 4);
        uVar7 = *(uint *)((long)&pCVar1->info + uVar3);
      } while (uVar7 >> 0x1c == 5);
      s = (CType *)((long)&pCVar1->info + uVar3);
      if (uVar7 >> 0x1c != 8) break;
      if ((uVar7 & 0xff0000) == 0x10000) {
        uVar8 = uVar8 | s->size;
      }
    }
    uVar8 = uVar7 & 0x3000000 | uVar8;
  }
  uVar4 = uVar5 & 0x3000000 | uVar4;
  if ((flags & 4) == 0) {
    if ((flags & 8) == 0) {
      if ((uVar8 & ~uVar4) == 0) {
        if ((uVar5 & 0xf0000000) == 0x40000000) {
          return 1;
        }
        if ((uVar7 & 0xf0000000) == 0x40000000) {
          return 1;
        }
        goto LAB_00136f0f;
      }
    }
    else {
LAB_00136f0f:
      if (uVar6 == uVar7 >> 0x1c) goto LAB_00136f33;
    }
    iVar2 = 0;
  }
  else {
    if (uVar4 != uVar8) {
      return 0;
    }
    if (uVar6 != uVar7 >> 0x1c) {
      return 0;
    }
LAB_00136f33:
    iVar2 = 0;
    if (d_00->size == s->size) {
      iVar2 = 0;
      if (uVar5 < 0x10000000) {
        if (((uVar7 ^ uVar5) & 0xc000000) == 0) {
          return 1;
        }
      }
      else if ((uVar5 & 0xe0000000) == 0x20000000) {
        iVar2 = lj_cconv_compatptr(cts,d_00,s,flags | 4);
      }
      else {
        if (uVar6 != 1) {
          return 1;
        }
        if (d_00 == s) {
          return 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}